

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture2DArrayView *src,float *texCoord,ReferenceParams *params)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  byte bVar9;
  bool bVar10;
  ulong uVar11;
  int i;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  Texture2DArrayView TVar26;
  Vector<float,_4> res_1;
  Vec3 triR [2];
  float triLod [2];
  IVec2 dstSize;
  Vec3 triT [2];
  Vec3 triS [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Vector<float,_4> res;
  Texture2DArrayView src_1;
  IVec2 srcSize;
  float local_108;
  uint uStack_104;
  undefined8 uStack_100;
  float local_f8 [8];
  float local_d8;
  uint local_d4;
  IVec2 local_d0;
  Texture2DArrayView local_c8;
  Vec3 local_b8;
  Vec3 local_ac;
  Vec3 local_98;
  Vec3 local_8c;
  undefined1 local_78 [16];
  pointer local_68;
  float local_58 [4];
  WrapMode local_48;
  ConstPixelBufferAccess *local_40;
  IVec2 local_38;
  
  fVar23 = *texCoord;
  fVar22 = texCoord[1];
  fVar1 = texCoord[3];
  fVar24 = texCoord[6];
  fVar25 = texCoord[9];
  fVar2 = texCoord[4];
  fVar3 = texCoord[7];
  fVar4 = texCoord[10];
  fVar5 = texCoord[2];
  fVar6 = texCoord[5];
  fVar7 = texCoord[8];
  fVar8 = texCoord[0xb];
  local_78 = ZEXT416(0);
  local_68 = (pointer)0x0;
  TVar26 = tcu::getEffectiveTextureView
                     (src,(vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           *)local_78,&params->sampler);
  local_40 = TVar26.m_levels;
  local_48 = TVar26.m_numLevels;
  fVar21 = 0.0;
  if (((params->super_RenderParams).flags & 2) != 0) {
    fVar21 = (params->super_RenderParams).bias;
  }
  local_d0.m_data[0] = dst->m_width;
  local_d0.m_data[1] = dst->m_height;
  local_38.m_data[1] = 0;
  local_38.m_data[0] = NEAREST;
  if (0 < (int)local_48) {
    local_38.m_data[0] = (local_40->m_size).m_data[0];
    local_38.m_data[1] = (local_40->m_size).m_data[1];
  }
  local_f8[0] = fVar5;
  local_f8[1] = fVar6;
  local_f8[2] = fVar7;
  local_f8[3] = fVar8;
  local_f8[4] = fVar7;
  local_f8[5] = fVar6;
  local_b8.m_data[0] = fVar22;
  local_b8.m_data[1] = fVar2;
  local_b8.m_data[2] = fVar3;
  local_ac.m_data[0] = fVar4;
  local_ac.m_data[1] = fVar3;
  local_ac.m_data[2] = fVar2;
  local_98.m_data[0] = fVar23;
  local_98.m_data[1] = fVar1;
  local_98.m_data[2] = fVar24;
  local_8c.m_data[0] = fVar25;
  local_8c.m_data[1] = fVar24;
  local_8c.m_data[2] = fVar1;
  fVar22 = computeNonProjectedTriLod(params->lodMode,&local_d0,&local_38,&local_98,&local_b8);
  fVar22 = fVar22 + fVar21;
  fVar23 = params->maxLod;
  if (fVar22 <= params->maxLod) {
    fVar23 = fVar22;
  }
  uVar20 = -(uint)(fVar22 < params->minLod);
  local_d8 = (float)(uVar20 & (uint)params->minLod | ~uVar20 & (uint)fVar23);
  fVar22 = computeNonProjectedTriLod(params->lodMode,&local_d0,&local_38,&local_8c,&local_ac);
  fVar22 = fVar22 + fVar21;
  fVar23 = params->maxLod;
  if (fVar22 <= params->maxLod) {
    fVar23 = fVar22;
  }
  uVar20 = -(uint)(fVar22 < params->minLod);
  local_d4 = uVar20 & (uint)params->minLod | ~uVar20 & (uint)fVar23;
  if (0 < dst->m_height) {
    iVar18 = 0;
    do {
      iVar12 = dst->m_width;
      if (0 < iVar12) {
        iVar19 = 0;
        do {
          fVar23 = ((float)iVar18 + 0.5) / (float)dst->m_height;
          fVar22 = ((float)iVar19 + 0.5) / (float)iVar12;
          bVar10 = 1.0 <= fVar22 + fVar23;
          if (bVar10) {
            fVar22 = 1.0 - fVar22;
            fVar23 = 1.0 - fVar23;
          }
          uVar11 = (ulong)bVar10;
          fVar1 = (&local_98)[uVar11].m_data[0];
          fVar24 = ((&local_98)[uVar11].m_data[1] - fVar1) * fVar23 +
                   ((&local_8c)[uVar11 - 1].m_data[2] - fVar1) * fVar22 + fVar1;
          fVar1 = (&local_b8)[uVar11].m_data[0];
          fVar25 = ((&local_b8)[uVar11].m_data[1] - fVar1) * fVar23 +
                   ((&local_ac)[uVar11 - 1].m_data[2] - fVar1) * fVar22 + fVar1;
          fVar1 = local_f8[uVar11 * 3];
          fVar23 = (local_f8[uVar11 * 3 + 1] - fVar1) * fVar23 +
                   (local_f8[uVar11 * 3 + 2] - fVar1) * fVar22 + fVar1;
          if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
            local_c8.m_numLevels =
                 (int)tcu::Texture2DArrayView::sampleCompare
                                ((Texture2DArrayView *)&local_48,&params->sampler,
                                 (params->super_RenderParams).ref,fVar24,fVar25,fVar23,
                                 (&local_d8)[uVar11]);
            local_c8._4_8_ = 0;
            local_c8.m_levels._4_4_ = 0x3f800000;
          }
          else {
            tcu::Texture2DArrayView::sample
                      (&local_c8,(Sampler *)&local_48,fVar24,fVar25,fVar23,(&local_d8)[uVar11]);
          }
          local_58[0] = 0.0;
          local_58[1] = 0.0;
          local_58[2] = 0.0;
          local_58[3] = 0.0;
          lVar14 = 0;
          do {
            local_58[lVar14] =
                 (float)(&local_c8.m_numLevels)[lVar14] *
                 (params->super_RenderParams).colorScale.m_data[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          _local_108 = 0;
          uStack_100 = 0;
          lVar14 = 0;
          do {
            (&local_108)[lVar14] =
                 local_58[lVar14] + (params->super_RenderParams).colorBias.m_data[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          bVar9 = dst->m_colorMask;
          uVar13 = 0;
          uVar20 = 0;
          if ((bVar9 & 1) != 0) {
            uVar15 = 0x7e - ((int)local_108 >> 0x17);
            uVar20 = (((uint)local_108 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar15 & 0x1f)) +
                     0x800000;
            if (8 < uVar15) {
              uVar20 = uVar15;
            }
            uVar20 = uVar20 >> 0x18;
          }
          if ((bVar9 & 2) != 0) {
            uVar15 = 0x7e - ((int)uStack_104 >> 0x17);
            uVar13 = ((uStack_104 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar15 & 0x1f)) +
                     0x800000;
            if (8 < uVar15) {
              uVar13 = uVar15;
            }
            uVar13 = uVar13 >> 0x10 & 0xff00;
          }
          uVar15 = 0;
          if ((bVar9 & 4) != 0) {
            uVar16 = 0x7e - ((int)(uint)uStack_100 >> 0x17);
            uVar15 = (((uint)uStack_100 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar16 & 0x1f)) +
                     0x800000;
            if (8 < uVar16) {
              uVar15 = uVar16;
            }
            uVar15 = uVar15 >> 8 & 0xff0000;
          }
          uVar16 = 0xff000000;
          if ((bVar9 & 8) != 0) {
            uVar17 = 0x7e - ((int)uStack_100._4_4_ >> 0x17);
            uVar16 = ((uStack_100._4_4_ & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar17 & 0x1f)) +
                     0x800000;
            if (8 < uVar17) {
              uVar16 = uVar17;
            }
            uVar16 = uVar16 & 0xff000000;
          }
          *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                   (long)((dst->m_y + iVar18) * dst->m_surface->m_width + dst->m_x + iVar19) * 4) =
               uVar13 | uVar20 | uVar15 | uVar16;
          iVar19 = iVar19 + 1;
          iVar12 = dst->m_width;
        } while (iVar19 < iVar12);
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 < dst->m_height);
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,(long)local_68 - local_78._0_8_);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture2DArrayView& src, const float* texCoord, const ReferenceParams& params)
{
	tcu::Vec4 sq = tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	tcu::Vec4 tq = tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	tcu::Vec4 rq = tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	DE_ASSERT(!(params.flags & ReferenceParams::PROJECTED)); // \todo [2012-02-17 pyry] Support projected lookups.
	sampleTextureNonProjected(dst, src, sq, tq, rq, params);
}